

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

void glu::logShaderProgram
               (TestLog *log,ProgramInfo *programInfo,size_t numShaders,ShaderInfo **shaderInfos)

{
  char *pcVar1;
  ProgramInfo *this;
  float local_2b4;
  byte local_289;
  float local_284;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  LogNumber<float> local_1c8;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  LogNumber<float> local_e8;
  ShaderInfo *local_80;
  ShaderInfo *shaderInfo;
  size_t shaderNdx_1;
  ShaderInfo **ppSStack_68;
  bool allShadersOk;
  size_t shaderNdx;
  LogShaderProgram local_50;
  ShaderInfo **local_28;
  ShaderInfo **shaderInfos_local;
  size_t numShaders_local;
  ProgramInfo *programInfo_local;
  TestLog *log_local;
  
  local_28 = shaderInfos;
  shaderInfos_local = (ShaderInfo **)numShaders;
  numShaders_local = (size_t)programInfo;
  programInfo_local = (ProgramInfo *)log;
  tcu::LogShaderProgram::LogShaderProgram
            (&local_50,(bool)(programInfo->linkOk & 1),&programInfo->infoLog);
  tcu::TestLog::operator<<(log,&local_50);
  tcu::LogShaderProgram::~LogShaderProgram(&local_50);
  for (ppSStack_68 = (ShaderInfo **)0x0; ppSStack_68 < shaderInfos_local;
      ppSStack_68 = (ShaderInfo **)((long)ppSStack_68 + 1)) {
    operator<<((TestLog *)programInfo_local,local_28[(long)ppSStack_68]);
  }
  tcu::TestLog::operator<<
            ((TestLog *)programInfo_local,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram);
  shaderNdx_1._7_1_ = 1;
  for (shaderInfo = (ShaderInfo *)0x0; this = programInfo_local, shaderInfo < shaderInfos_local;
      shaderInfo = (ShaderInfo *)((long)&shaderInfo->type + 1)) {
    local_80 = local_28[(long)shaderInfo];
    pcVar1 = logShaderProgram::s_compileTimeDesc[local_80->type].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pcVar1,&local_109);
    pcVar1 = logShaderProgram::s_compileTimeDesc[local_80->type].description;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar1,&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"ms",&local_159);
    local_284 = (float)local_80->compileTimeUs;
    tcu::LogNumber<float>::LogNumber
              (&local_e8,&local_108,&local_130,&local_158,QP_KEY_TAG_TIME,local_284 / 1000.0);
    tcu::TestLog::operator<<((TestLog *)this,&local_e8);
    tcu::LogNumber<float>::~LogNumber(&local_e8);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    local_289 = 0;
    if ((shaderNdx_1._7_1_ & 1) != 0) {
      local_289 = local_80->compileOk;
    }
    shaderNdx_1._7_1_ = local_289 & 1;
  }
  if (shaderNdx_1._7_1_ != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"LinkTime",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"Link time",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"ms",&local_239);
    local_2b4 = (float)*(ulong *)(numShaders_local + 0x28);
    tcu::LogNumber<float>::LogNumber
              (&local_1c8,&local_1e8,&local_210,&local_238,QP_KEY_TAG_TIME,local_2b4 / 1000.0);
    tcu::TestLog::operator<<((TestLog *)this,&local_1c8);
    tcu::LogNumber<float>::~LogNumber(&local_1c8);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
  }
  return;
}

Assistant:

static void logShaderProgram (tcu::TestLog& log, const ProgramInfo& programInfo, size_t numShaders, const ShaderInfo* const* shaderInfos)
{
	log << tcu::TestLog::ShaderProgram(programInfo.linkOk, programInfo.infoLog);
	try
	{
		for (size_t shaderNdx = 0; shaderNdx < numShaders; ++shaderNdx)
			log << *shaderInfos[shaderNdx];
	}
	catch (...)
	{
		log << tcu::TestLog::EndShaderProgram;
		throw;
	}
	log << tcu::TestLog::EndShaderProgram;

	// Write statistics.
	{
		static const struct
		{
			const char*		name;
			const char*		description;
		} s_compileTimeDesc[] =
		{
			{ "VertexCompileTime",			"Vertex shader compile time"					},
			{ "FragmentCompileTime",		"Fragment shader compile time"					},
			{ "GeometryCompileTime",		"Geometry shader compile time"					},
			{ "TessControlCompileTime",		"Tesselation control shader compile time"		},
			{ "TessEvaluationCompileTime",	"Tesselation evaluation shader compile time"	},
			{ "ComputeCompileTime",			"Compute shader compile time"					},
		};
		DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_compileTimeDesc) == SHADERTYPE_LAST);

		bool allShadersOk = true;

		for (size_t shaderNdx = 0; shaderNdx < numShaders; ++shaderNdx)
		{
			const ShaderInfo&	shaderInfo	= *shaderInfos[shaderNdx];

			log << tcu::TestLog::Float(s_compileTimeDesc[shaderInfo.type].name,
									   s_compileTimeDesc[shaderInfo.type].description,
									   "ms", QP_KEY_TAG_TIME, (float)shaderInfo.compileTimeUs / 1000.0f);

			allShadersOk = allShadersOk && shaderInfo.compileOk;
		}

		if (allShadersOk)
			log << tcu::TestLog::Float("LinkTime", "Link time", "ms", QP_KEY_TAG_TIME, (float)programInfo.linkTimeUs / 1000.0f);
	}
}